

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

string * __thiscall
flatbuffers::rust::RustGenerator::NamespacedNativeName_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,EnumDef *def)

{
  Namespace *ns;
  string local_40;
  
  ns = (def->super_Definition).defined_namespace;
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_40,&this->namer_);
  WrapInNameSpace(__return_storage_ptr__,this,ns,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedNativeName(const EnumDef &def) {
    return WrapInNameSpace(def.defined_namespace, namer_.ObjectType(def));
  }